

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

MessageProcessingResult __thiscall
helics::TimeCoordinator::checkTimeGrant(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  baseType bVar1;
  Time desiredGrantTime;
  Time desiredGrantTime_00;
  Time desiredGrantTime_01;
  bool bVar2;
  GrantDelayMode GVar3;
  int *piVar4;
  TimeCoordinator *in_RDI;
  DependencyInfo *dep;
  iterator __end5;
  iterator __begin5;
  TimeDependencies *__range5;
  int restrictionLevel;
  bool restrictionAdvance;
  bool restricted;
  bool allowed;
  GrantDelayMode delayMode;
  bool sendAll;
  MessageProcessingResult ret;
  BaseTimeCoordinator *in_stack_00000130;
  TimeCoordinator *in_stack_00000138;
  GlobalFederateId in_stack_00000144;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  TimeDependencies *in_stack_ffffffffffffff20;
  __int_type_conflict __i;
  undefined4 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2c;
  undefined1 in_stack_ffffffffffffff2d;
  byte in_stack_ffffffffffffff2e;
  IterationRequest IVar5;
  bool local_c1;
  GlobalFederateId local_9c;
  uint local_98;
  BaseType local_94;
  reference local_90;
  DependencyInfo *local_88;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_80;
  TimeDependencies *local_78;
  int local_70;
  byte local_6b;
  byte local_6a;
  byte local_69;
  baseType local_68;
  baseType local_60;
  undefined8 in_stack_ffffffffffffffa8;
  undefined2 uVar6;
  undefined5 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb5;
  byte bVar7;
  MessageProcessingResult MVar8;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  TimeRepresentation<count_time<9,_long>_> local_38;
  baseType local_30;
  baseType local_28;
  TimeRepresentation<count_time<9,_long>_> local_20;
  TimeRepresentation<count_time<9,_long>_> local_18;
  TimeCoordinator *this_00;
  GlobalFederateId local_8;
  MessageProcessingResult local_1;
  
  uVar6 = (undefined2)((ulong)in_stack_ffffffffffffffa8 >> 0x30);
  this_00 = in_RDI;
  (*(in_RDI->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[2])();
  local_18 = TimeRepresentation<count_time<9,_long>_>::maxVal();
  bVar2 = TimeRepresentation<count_time<9,_long>_>::operator==(&in_RDI->time_exec,&local_18);
  if (bVar2) {
    local_20 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator==(&in_RDI->time_allow,&local_20);
    if (bVar2) {
      local_28 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
      (in_RDI->time_granted).internalTimeCode = local_28;
      local_30 = (baseType)TimeRepresentation<count_time<9,_long>_>::maxVal();
      (in_RDI->time_grantBase).internalTimeCode = local_30;
      BaseTimeCoordinator::disconnect(in_stack_00000130);
      return HALTED;
    }
  }
  bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<=
                    (&in_RDI->time_block,&in_RDI->time_exec);
  local_c1 = false;
  if (bVar2) {
    local_38 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    local_c1 = TimeRepresentation<count_time<9,_long>_>::operator<(&in_RDI->time_block,&local_38);
  }
  if (local_c1 != false) {
    bVar2 = GlobalFederateId::isValid(&local_8);
    if ((bVar2) &&
       (bVar2 = GlobalFederateId::operator!=
                          (&local_8,(GlobalFederateId)
                                    (in_RDI->super_BaseTimeCoordinator).mSourceId.gid), bVar2)) {
      sendTimeRequest(in_stack_00000138,in_stack_00000144);
    }
    return CONTINUE_PROCESSING;
  }
  if ((((in_RDI->super_BaseTimeCoordinator).nonGranting & 1U) != 0) &&
     (bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<
                        (&in_RDI->time_exec,&in_RDI->time_requested), bVar2)) {
    bVar2 = GlobalFederateId::isValid(&local_8);
    if ((bVar2) &&
       (bVar2 = GlobalFederateId::operator!=
                          (&local_8,(GlobalFederateId)
                                    (in_RDI->super_BaseTimeCoordinator).mSourceId.gid), bVar2)) {
      sendTimeRequest(in_stack_00000138,in_stack_00000144);
    }
    return CONTINUE_PROCESSING;
  }
  MVar8 = CONTINUE_PROCESSING;
  bVar7 = in_RDI->needSendAll & 1;
  in_RDI->needSendAll = false;
  IVar5 = in_RDI->iterating;
  if (IVar5 == NO_ITERATIONS) {
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                      (&in_RDI->time_allow,&in_RDI->time_exec);
    if (bVar2) {
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)
                 CONCAT17(IVar5,CONCAT16(in_stack_ffffffffffffff2e,
                                         CONCAT15(in_stack_ffffffffffffff2d,
                                                  CONCAT14(in_stack_ffffffffffffff2c,
                                                           in_stack_ffffffffffffff28)))),
                 (__int_type_conflict)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      (in_RDI->super_BaseTimeCoordinator).sequenceCounter = 0;
      in_RDI->hasIterationData = false;
      updateTimeGrant(this_00);
      return NEXT_STEP;
    }
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator==
                      (&in_RDI->time_allow,&in_RDI->time_exec);
    if (bVar2) {
      if ((((in_RDI->info).wait_for_current_time_updates & 1U) == 0) &&
         (bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<=
                            (&in_RDI->time_requested,&in_RDI->time_exec), bVar2)) {
        std::__atomic_base<int>::operator=
                  ((__atomic_base<int> *)
                   CONCAT17(IVar5,CONCAT16(in_stack_ffffffffffffff2e,
                                           CONCAT15(in_stack_ffffffffffffff2d,
                                                    CONCAT14(in_stack_ffffffffffffff2c,
                                                             in_stack_ffffffffffffff28)))),
                   (__int_type_conflict)((ulong)in_stack_ffffffffffffff20 >> 0x20));
        (in_RDI->super_BaseTimeCoordinator).sequenceCounter = 0;
        in_RDI->hasIterationData = false;
        updateTimeGrant(this_00);
        return NEXT_STEP;
      }
      in_stack_ffffffffffffff2e = (in_RDI->info).wait_for_current_time_updates;
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                        (&in_RDI->time_requested,&in_RDI->time_exec);
      GVar3 = getDelayMode((bool)(in_stack_ffffffffffffff2e & 1),bVar2);
      bVar1 = (in_RDI->time_exec).internalTimeCode;
      desiredGrantTime.internalTimeCode._4_4_ = in_stack_ffffffffffffffbc;
      desiredGrantTime.internalTimeCode._0_4_ = in_stack_ffffffffffffffb8;
      bVar2 = TimeDependencies::checkIfReadyForTimeGrant
                        ((TimeDependencies *)
                         CONCAT17(MVar8,CONCAT16(bVar7,CONCAT15(GVar3,in_stack_ffffffffffffffb0))),
                         SUB81((ulong)bVar1 >> 0x38,0),desiredGrantTime,
                         (GrantDelayMode)((ulong)bVar1 >> 0x30));
      if (bVar2) {
        std::__atomic_base<int>::operator=
                  ((__atomic_base<int> *)
                   CONCAT17(IVar5,CONCAT16(in_stack_ffffffffffffff2e,
                                           CONCAT15(in_stack_ffffffffffffff2d,
                                                    CONCAT14(in_stack_ffffffffffffff2c,
                                                             in_stack_ffffffffffffff28)))),
                   (__int_type_conflict)((ulong)in_stack_ffffffffffffff20 >> 0x20));
        (in_RDI->super_BaseTimeCoordinator).sequenceCounter = 0;
        in_RDI->hasIterationData = false;
        updateTimeGrant(this_00);
        return NEXT_STEP;
      }
    }
  }
  else if ((byte)(IVar5 - FORCE_ITERATION) < 2) {
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                      (&in_RDI->time_allow,&in_RDI->time_exec);
    __i = (__int_type_conflict)((ulong)in_stack_ffffffffffffff20 >> 0x20);
    if (bVar2) {
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<=
                        (&in_RDI->time_exec,&in_RDI->time_granted);
      if ((bVar2) || ((in_RDI->hasIterationData & 1U) != 0)) {
        std::__atomic_base<int>::operator++(&(in_RDI->iteration).super___atomic_base<int>);
        in_RDI->hasIterationData = false;
        updateTimeGrant(this_00);
        return ITERATING;
      }
      if (in_RDI->iterating == FORCE_ITERATION) {
        std::__atomic_base<int>::operator++(&(in_RDI->iteration).super___atomic_base<int>);
      }
      else {
        std::__atomic_base<int>::operator=
                  ((__atomic_base<int> *)
                   CONCAT17(IVar5,CONCAT16(in_stack_ffffffffffffff2e,
                                           CONCAT15(in_stack_ffffffffffffff2d,
                                                    CONCAT14(in_stack_ffffffffffffff2c,
                                                             in_stack_ffffffffffffff28)))),__i);
        (in_RDI->super_BaseTimeCoordinator).sequenceCounter = 0;
      }
      updateTimeGrant(this_00);
      if (in_RDI->iterating == FORCE_ITERATION) {
        return ITERATING;
      }
      return NEXT_STEP;
    }
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator==
                      (&in_RDI->time_allow,&in_RDI->time_exec);
    if (bVar2) {
      bVar2 = TimeRepresentation<count_time<9,_long>_>::operator==
                        (&in_RDI->time_allow,&in_RDI->time_requested);
      if (bVar2) {
        if (((in_RDI->info).wait_for_current_time_updates & 1U) == 0) {
          bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<=
                            (&in_RDI->time_requested,&in_RDI->time_exec);
          if (bVar2) {
            MVar8 = NEXT_STEP;
            goto LAB_005516b7;
          }
          local_60 = (in_RDI->time_exec).internalTimeCode;
          desiredGrantTime_00.internalTimeCode._4_4_ = in_stack_ffffffffffffffbc;
          desiredGrantTime_00.internalTimeCode._0_4_ = in_stack_ffffffffffffffb8;
          bVar2 = TimeDependencies::checkIfReadyForTimeGrant
                            ((TimeDependencies *)
                             CONCAT17(MVar8,CONCAT16(bVar7,CONCAT15(in_stack_ffffffffffffffb5,
                                                                    in_stack_ffffffffffffffb0))),
                             SUB21((ushort)uVar6 >> 8,0),desiredGrantTime_00,(GrantDelayMode)uVar6);
          if (bVar2) {
            MVar8 = NEXT_STEP;
            goto LAB_005516b7;
          }
        }
        MVar8 = CONTINUE_PROCESSING;
      }
      else {
        in_stack_ffffffffffffff20 = &(in_RDI->super_BaseTimeCoordinator).dependencies;
        local_68 = (in_RDI->time_exec).internalTimeCode;
        getDelayMode((bool)((in_RDI->info).wait_for_current_time_updates & 1),false);
        desiredGrantTime_01.internalTimeCode._4_4_ = in_stack_ffffffffffffffbc;
        desiredGrantTime_01.internalTimeCode._0_4_ = in_stack_ffffffffffffffb8;
        bVar2 = TimeDependencies::checkIfReadyForTimeGrant
                          ((TimeDependencies *)
                           CONCAT17(MVar8,CONCAT16(bVar7,CONCAT15(in_stack_ffffffffffffffb5,
                                                                  in_stack_ffffffffffffffb0))),
                           SUB21((ushort)uVar6 >> 8,0),desiredGrantTime_01,(GrantDelayMode)uVar6);
        if (bVar2) {
          if ((in_RDI->hasIterationData & 1U) == 0) {
            bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                              (&in_RDI->time_exec,&in_RDI->time_granted);
            if (bVar2) {
              MVar8 = NEXT_STEP;
            }
            else {
              local_69 = ((in_RDI->info).wait_for_current_time_updates ^ 0xffU) & 1;
              local_6b = (in_RDI->info).restrictive_time_policy & 1;
              local_70 = 0x32;
              local_6a = local_6b;
              if (local_69 != 0) {
                local_78 = &(in_RDI->super_BaseTimeCoordinator).dependencies;
                local_80._M_current =
                     (DependencyInfo *)
                     TimeDependencies::begin
                               ((TimeDependencies *)
                                CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
                local_88 = (DependencyInfo *)
                           TimeDependencies::end
                                     ((TimeDependencies *)
                                      CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18))
                ;
                while (bVar2 = __gnu_cxx::
                               operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                         ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                           *)in_stack_ffffffffffffff20,
                                          (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                           *)CONCAT17(in_stack_ffffffffffffff1f,
                                                      in_stack_ffffffffffffff18)),
                      ((bVar2 ^ 0xffU) & 1) != 0) {
                  local_90 = __gnu_cxx::
                             __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             ::operator*(&local_80);
                  if ((((local_90->dependency & 1U) != 0) &&
                      (bVar2 = TimeRepresentation<count_time<9,_long>_>::operator>
                                         ((TimeRepresentation<count_time<9,_long>_> *)local_90,
                                          &in_RDI->time_exec), !bVar2)) &&
                     (local_90->connection != SELF)) {
                    local_94 = (in_RDI->super_BaseTimeCoordinator).mSourceId.gid;
                    bVar2 = GlobalFederateId::operator!=
                                      (&(local_90->super_TimeData).minFed,(GlobalFederateId)local_94
                                      );
                    if (bVar2) {
                      local_69 = 0;
                    }
                    if ((local_90->super_TimeData).responseSequenceCounter !=
                        (in_RDI->super_BaseTimeCoordinator).sequenceCounter) {
                      local_6b = 0;
                      local_69 = 0;
                      break;
                    }
                    if ((local_6a & 1) != 0) {
                      local_98 = (uint)(local_90->super_TimeData).restrictionLevel;
                      piVar4 = CLI::std::min<int>(&local_70,(int *)&local_98);
                      local_70 = *piVar4;
                    }
                  }
                  __gnu_cxx::
                  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                  ::operator++(&local_80);
                }
              }
              if ((local_69 & 1) == 0) {
                if ((local_6b & 1) != 0) {
                  in_RDI->currentRestrictionLevel = (char)local_70 + '\x01';
                  bVar7 = 1;
                  (in_RDI->super_BaseTimeCoordinator).sequenceCounter =
                       (in_RDI->super_BaseTimeCoordinator).sequenceCounter + 1;
                }
                MVar8 = CONTINUE_PROCESSING;
              }
              else if ((local_6a & 1) == 0) {
                MVar8 = NEXT_STEP;
              }
              else if (local_70 < 1) {
                if ((uint)in_RDI->currentRestrictionLevel != local_70 + 1U) {
                  in_RDI->currentRestrictionLevel = (char)local_70 + '\x01';
                  bVar7 = 1;
                  (in_RDI->super_BaseTimeCoordinator).sequenceCounter =
                       (in_RDI->super_BaseTimeCoordinator).sequenceCounter + 1;
                }
                MVar8 = CONTINUE_PROCESSING;
              }
              else {
                MVar8 = NEXT_STEP;
              }
            }
          }
          else {
            MVar8 = ITERATING;
          }
        }
      }
    }
  }
LAB_005516b7:
  if (MVar8 == CONTINUE_PROCESSING) {
    bVar2 = GlobalFederateId::isValid(&local_8);
    if ((bVar2) || (local_1 = MVar8, (bVar7 & 1) != 0)) {
      if ((bVar7 & 1) == 0) {
        bVar2 = GlobalFederateId::operator!=
                          (&local_8,(GlobalFederateId)
                                    (in_RDI->super_BaseTimeCoordinator).mSourceId.gid);
        local_1 = MVar8;
        if (bVar2) {
          sendTimeRequest(in_stack_00000138,in_stack_00000144);
          local_1 = MVar8;
        }
      }
      else {
        memset(&local_9c,0,4);
        GlobalFederateId::GlobalFederateId(&local_9c);
        sendTimeRequest(in_stack_00000138,in_stack_00000144);
        local_1 = MVar8;
      }
    }
  }
  else if (MVar8 == NEXT_STEP) {
    if (in_RDI->iterating == FORCE_ITERATION) {
      std::__atomic_base<int>::operator++(&(in_RDI->iteration).super___atomic_base<int>);
      in_RDI->hasIterationData = false;
      (in_RDI->time_exec).internalTimeCode = (in_RDI->time_granted).internalTimeCode;
      updateTimeGrant(this_00);
      local_1 = ITERATING;
    }
    else {
      std::__atomic_base<int>::operator=
                ((__atomic_base<int> *)
                 CONCAT17(IVar5,CONCAT16(in_stack_ffffffffffffff2e,
                                         CONCAT15(in_stack_ffffffffffffff2d,
                                                  CONCAT14(in_stack_ffffffffffffff2c,
                                                           in_stack_ffffffffffffff28)))),
                 (__int_type_conflict)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      (in_RDI->super_BaseTimeCoordinator).sequenceCounter = 0;
      in_RDI->hasIterationData = false;
      updateTimeGrant(this_00);
      local_1 = MVar8;
    }
  }
  else {
    local_1 = MVar8;
    if (MVar8 == ITERATING) {
      std::__atomic_base<int>::operator++(&(in_RDI->iteration).super___atomic_base<int>);
      in_RDI->hasIterationData = false;
      updateTimeGrant(this_00);
      local_1 = MVar8;
    }
  }
  return local_1;
}

Assistant:

MessageProcessingResult TimeCoordinator::checkTimeGrant(GlobalFederateId triggerFed)
{
    updateTimeFactors();
    if (time_exec == Time::maxVal()) {
        if (time_allow == Time::maxVal()) {
            time_granted = Time::maxVal();
            time_grantBase = Time::maxVal();
            disconnect();
            return MessageProcessingResult::HALTED;
        }
    }
    if (time_block <= time_exec && time_block < Time::maxVal()) {
        if (triggerFed.isValid()) {
            if (triggerFed != mSourceId) {
                sendTimeRequest(triggerFed);
            }
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    if ((nonGranting && time_exec < time_requested)) {
        if (triggerFed.isValid()) {
            if (triggerFed != mSourceId) {
                sendTimeRequest(triggerFed);
            }
        }
        return MessageProcessingResult::CONTINUE_PROCESSING;
    }
    // if ((iterating == IterationRequest::NO_ITERATIONS) ||
    //     (time_exec > time_granted && iterating == IterationRequest::ITERATE_IF_NEEDED)) {
    //
    //     if (time_allow > time_exec) {
    //         iteration = 0;
    //         updateTimeGrant();
    //         return MessageProcessingResult::NEXT_STEP;
    //     }
    //     if (time_allow == time_exec) {
    //         if (!info.wait_for_current_time_updates) {
    //             if (time_requested <= time_exec) {
    //                 // this is the non interrupted case
    //                 iteration = 0;
    //                 updateTimeGrant();
    //                 return MessageProcessingResult::NEXT_STEP;
    //             }
    //             if (dependencies.checkIfReadyForTimeGrant(false, time_exec)) {
    //                 iteration = 0;
    //                 updateTimeGrant();
    //                 return MessageProcessingResult::NEXT_STEP;
    //             }
    //         } else {
    //             // if the wait_for_current_time_updates flag is set then time_allow must be
    //             greater
    //             // than time_exec
    //         }
    //     }
    // } else {
    //     if (time_allow > time_exec) {
    //         ++iteration;
    //         updateTimeGrant();
    //         return MessageProcessingResult::ITERATING;
    //     }
    //     if (time_allow == time_exec)  // time_allow==time_exec==time_granted
    //     {
    //         if (dependencies.checkIfReadyForTimeGrant(true, time_exec)) {
    //             ++iteration;
    //             updateTimeGrant();
    //             return MessageProcessingResult::ITERATING;
    //         }
    //     }
    // }
    auto ret = MessageProcessingResult::CONTINUE_PROCESSING;
    bool sendAll{needSendAll};
    needSendAll = false;
    switch (iterating) {
        case IterationRequest::NO_ITERATIONS:
            if (time_allow > time_exec) {
                iteration = 0;
                sequenceCounter = 0;
                hasIterationData = false;
                updateTimeGrant();
                return MessageProcessingResult::NEXT_STEP;
            }
            if (time_allow == time_exec) {
                if (!info.wait_for_current_time_updates) {
                    if (time_requested <= time_exec) {
                        // this is the non interrupted case
                        iteration = 0;
                        sequenceCounter = 0;
                        hasIterationData = false;
                        updateTimeGrant();
                        return MessageProcessingResult::NEXT_STEP;
                    }
                }

                auto delayMode =
                    getDelayMode(info.wait_for_current_time_updates, (time_requested > time_exec));
                if (dependencies.checkIfReadyForTimeGrant(false, time_exec, delayMode)) {
                    iteration = 0;
                    sequenceCounter = 0;
                    hasIterationData = false;
                    updateTimeGrant();
                    return MessageProcessingResult::NEXT_STEP;
                }

                // if the wait_for_current_time_updates flag is set then time_allow must be greater
                // than time_exec
            }
            break;
        case IterationRequest::ITERATE_IF_NEEDED:
        case IterationRequest::FORCE_ITERATION:
            if (time_allow > time_exec) {
                if (time_exec <= time_granted || hasIterationData) {
                    ++iteration;
                    hasIterationData = false;
                    updateTimeGrant();
                    return MessageProcessingResult::ITERATING;
                }
                if (iterating == IterationRequest::FORCE_ITERATION) {
                    ++iteration;
                } else {
                    iteration = 0;
                    sequenceCounter = 0;
                }

                updateTimeGrant();
                return (iterating == IterationRequest::FORCE_ITERATION) ?
                    MessageProcessingResult::ITERATING :
                    MessageProcessingResult::NEXT_STEP;
            }

            if (time_allow == time_exec) {
                if (time_allow == time_requested) {
                    if (!info.wait_for_current_time_updates) {
                        if (time_requested <= time_exec) {
                            // this is the non interrupted case
                            ret = MessageProcessingResult::NEXT_STEP;
                            break;
                        }
                        if (dependencies.checkIfReadyForTimeGrant(false,
                                                                  time_exec,
                                                                  GrantDelayMode::NONE)) {
                            ret = MessageProcessingResult::NEXT_STEP;
                            break;
                        }
                    }
                    ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    break;
                }
                if (dependencies.checkIfReadyForTimeGrant(
                        true, time_exec, getDelayMode(info.wait_for_current_time_updates, false))) {
                    if (hasIterationData) {
                        ret = MessageProcessingResult::ITERATING;
                        break;
                    }
                    if (time_exec > time_granted) {
                        ret = MessageProcessingResult::NEXT_STEP;
                        break;
                    }
                    // time_
                    bool allowed{!info.wait_for_current_time_updates};
                    bool restricted{info.restrictive_time_policy};
                    bool restrictionAdvance{restricted};
                    int restrictionLevel{50};
                    if (allowed) {
                        for (const auto& dep : dependencies) {
                            if (!dep.dependency) {
                                continue;
                            }
                            if (dep.next > time_exec || dep.connection == ConnectionType::SELF) {
                                continue;
                            }

                            if (dep.minFed != mSourceId) {
                                allowed = false;
                            }
                            if (dep.responseSequenceCounter == sequenceCounter) {
                                if (restricted) {
                                    restrictionLevel =
                                        (std::min)(restrictionLevel,
                                                   static_cast<int>(dep.restrictionLevel));
                                }

                            } else {
                                restrictionAdvance = false;
                                allowed = false;
                                break;
                            }
                        }
                    }
                    if (allowed) {
                        if (restricted) {
                            if (restrictionLevel >= 1) {
                                ret = MessageProcessingResult::NEXT_STEP;
                            } else {
                                if (currentRestrictionLevel != restrictionLevel + 1) {
                                    currentRestrictionLevel = restrictionLevel + 1;
                                    sendAll = true;
                                    ++sequenceCounter;
                                }

                                ret = MessageProcessingResult::CONTINUE_PROCESSING;
                            }
                        } else {
                            ret = MessageProcessingResult::NEXT_STEP;
                        }

                    } else {
                        if (restrictionAdvance) {
                            currentRestrictionLevel = restrictionLevel + 1;
                            sendAll = true;
                            ++sequenceCounter;
                        }
                        ret = MessageProcessingResult::CONTINUE_PROCESSING;
                    }
                }
            }

            break;
        default:
            break;
    }

    switch (ret) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            if (triggerFed.isValid() || sendAll) {
                if (sendAll) {
                    sendTimeRequest(GlobalFederateId{});
                } else {
                    if (triggerFed != mSourceId) {
                        sendTimeRequest(triggerFed);
                    }
                }
            }
            break;
        case MessageProcessingResult::ITERATING:
            ++iteration;
            hasIterationData = false;
            updateTimeGrant();
            break;
        case MessageProcessingResult::NEXT_STEP:
            if (iterating == IterationRequest::FORCE_ITERATION) {
                ++iteration;
                hasIterationData = false;
                time_exec = time_granted;
                updateTimeGrant();
                ret = MessageProcessingResult::ITERATING;
            } else {
                iteration = 0;
                sequenceCounter = 0;
                hasIterationData = false;
                updateTimeGrant();
            }
            break;
        default:
            break;
    }

    return ret;
}